

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

int __thiscall Sudoku::kolikBitu(Sudoku *this,int x,int y)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  for (uVar2 = (this->s).sloupce[x] | (this->s).radky[y] | (this->s).ctverce[x / 3][y / 3];
      uVar2 != 0; uVar2 = uVar2 >> 1) {
    iVar1 = iVar1 + (uVar2 & 1);
  }
  return iVar1;
}

Assistant:

int Sudoku::kolikBitu (int x, int y)
{
  // sjednoceni mnozin - zjistime co je zakazano pouzit na nasi pozci
  unsigned int zakazano = s.radky[y] | s.sloupce[x] | s.ctverce[x/3][y/3];
  // akumulator
  unsigned int akum;
  // provadime bitovy posun doprava dokud neni zakazano = 0
  for (akum = 0; zakazano; zakazano >>= 1)
  {
    // kdyz je na nejnizsim bitu 1, zvysime akumulator
    akum += zakazano & 1;
  }
  return akum; // vratime kolik bitu je nastaveno
}